

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

double cholmod(double *A,int N,double *L,double eps,double maxinp)

{
  long lVar1;
  double dVar2;
  double *array;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *local_48;
  
  array = (double *)malloc((long)N * (long)N * 8);
  if (eps < 0.0) {
    dVar13 = sqrt(eps);
  }
  else {
    dVar13 = SQRT(eps);
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  uVar11 = (ulong)(uint)N;
  if (0 < N) {
    iVar3 = 0;
    uVar6 = 0;
    do {
      array[uVar6] = A[iVar3];
      uVar6 = uVar6 + 1;
      iVar3 = iVar3 + N + 1;
    } while (uVar11 != uVar6);
  }
  if (N != 0) {
    memset(L,0,(ulong)(N * N + (uint)(N * N == 0)) << 3);
  }
  dVar14 = array_max_abs(array,N);
  dVar18 = maxinp;
  if ((maxinp == 0.0) && (!NAN(maxinp))) {
    if (dVar14 < 0.0) {
      dVar18 = sqrt(dVar14);
    }
    else {
      dVar18 = SQRT(dVar14);
    }
  }
  if (eps < 0.0) {
    dVar14 = sqrt(eps);
  }
  else {
    dVar14 = SQRT(eps);
  }
  if (N < 1) {
    dVar15 = 0.0;
  }
  else {
    pdVar10 = L + uVar11;
    uVar12 = 1;
    uVar6 = 0;
    pdVar7 = L;
    dVar19 = 0.0;
    local_48 = pdVar10;
    do {
      dVar15 = 0.0;
      if (uVar6 != 0) {
        uVar4 = 0;
        do {
          dVar15 = dVar15 + pdVar7[uVar4] * pdVar7[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      lVar1 = uVar6 * uVar11 + uVar6;
      L[lVar1] = A[lVar1] - dVar15;
      uVar4 = uVar6 + 1;
      dVar15 = 0.0;
      if (uVar4 < uVar11) {
        dVar15 = 0.0;
        pdVar5 = local_48;
        uVar8 = uVar12;
        do {
          dVar17 = 0.0;
          if (uVar6 != 0) {
            uVar9 = 0;
            do {
              dVar17 = dVar17 + pdVar7[uVar9] * pdVar5[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          dVar2 = A[uVar6 * uVar11 + uVar8];
          L[uVar6 + uVar8 * uVar11] = dVar2 - dVar17;
          dVar17 = ABS(dVar2 - dVar17);
          if (dVar17 <= dVar15) {
            dVar17 = dVar15;
          }
          dVar15 = dVar17;
          uVar8 = uVar8 + 1;
          pdVar5 = pdVar5 + uVar11;
        } while (uVar8 != uVar11);
      }
      dVar17 = dVar15 / dVar18;
      if (dVar15 / dVar18 <= dVar13 * maxinp) {
        dVar17 = dVar13 * maxinp;
      }
      dVar2 = L[lVar1];
      dVar15 = dVar19;
      if (dVar2 <= dVar17 * dVar17) {
        dVar16 = dVar14 * dVar18;
        if (dVar14 * dVar18 <= dVar17) {
          dVar16 = dVar17;
        }
        dVar15 = dVar16 * dVar16 - dVar2;
        if (dVar15 <= dVar19) {
          dVar15 = dVar19;
        }
      }
      else if (dVar2 < 0.0) {
        dVar16 = sqrt(dVar2);
      }
      else {
        dVar16 = SQRT(dVar2);
      }
      L[lVar1] = dVar16;
      uVar6 = uVar11;
      pdVar5 = pdVar10;
      if (uVar4 < uVar11) {
        do {
          *pdVar5 = *pdVar5 / L[lVar1];
          uVar6 = uVar6 - 1;
          pdVar5 = pdVar5 + uVar11;
        } while (uVar12 != uVar6);
      }
      uVar12 = uVar12 + 1;
      pdVar7 = pdVar7 + uVar11;
      local_48 = local_48 + uVar11;
      pdVar10 = pdVar10 + uVar11 + 1;
      uVar6 = uVar4;
      dVar19 = dVar15;
    } while (uVar4 != uVar11);
  }
  free(array);
  return dVar15;
}

Assistant:

double cholmod(double *A, int N, double *L, double eps,double maxinp) {
	/*
	 * Algorithm 5.5.2 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	int i,j,k,step,step2;
	double ls;
	double *U22;
	double maxadd,maxdiag,minl,minl2,minljj;
	
	U22 = (double*) malloc(sizeof(double) * N * N);
	
	minl = sqrt(sqrt(eps)) * maxinp;
	maxadd = 0.0;
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	for(i = 0; i < N * N;++i) {
		L[i] = 0.0;
	}
	
	maxdiag = array_max_abs(U22,N);
	
	if ( maxinp == 0.0) {
		maxinp = sqrt(maxdiag);
	}
	
	minl2 = sqrt(eps) * maxinp;
	
	for(j = 0; j < N;++j) {
		step = j * N;
		ls = 0.0;
		for(i = 0; i < j;++i) {
			ls += L[step+i] * L[step+i];
		}
		
		L[step+j] = A[step+j] - ls;
		minljj = 0.0;
		for(i = j+1; i < N;++i) {
			ls = 0.0;
			step2 = i * N;
			for(k = 0;k < j;++k) {
				ls += L[step+k] * L[step2+k];
			}
			L[step2+j] = A[step+i] - ls;
			
			if (fabs(L[step2+j]) > minljj) {
				minljj = fabs(L[step2+j]);
			}
		}
		
		if (minljj/maxinp > minl) {
			minljj = minljj/maxinp;
		} else {
			minljj = minl;
		}
		
		if (L[step+j] > minljj*minljj) {
				L[step+j] = sqrt(L[step+j]);
		} else {
			if (minljj < minl2) {
				minljj = minl2;
			}
			
			if (maxadd < (minljj*minljj - L[step+j])) {
				maxadd = minljj*minljj - L[step+j];
			}
			
			L[step+j] = minljj;
		}
		
		for(i = j+1; i < N;++i) {
			L[i*N+j] /= L[step+j];
		}
		
		
	}
	
	free(U22);
	
	return maxadd;
}